

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoryDecoder.h
# Opt level: O3

StandardVariable *
KDIS::DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::StandardVariable>::FactoryDecode
          (KINT32 EnumVal,KDataStream *stream)

{
  long lVar1;
  StandardVariable *pSVar2;
  long lVar3;
  
  if (m_mDecoders._16_8_ != 0) {
    lVar1 = 0x327638;
    lVar3 = m_mDecoders._16_8_;
    do {
      if (EnumVal <= *(int *)(lVar3 + 0x20)) {
        lVar1 = lVar3;
      }
      lVar3 = *(long *)(lVar3 + 0x10 + (ulong)(*(int *)(lVar3 + 0x20) < EnumVal) * 8);
    } while (lVar3 != 0);
    if ((lVar1 != 0x327638) && (*(int *)(lVar1 + 0x20) <= EnumVal)) {
      pSVar2 = (StandardVariable *)
               (**(code **)(**(long **)(lVar1 + 0x30) + 0x10))
                         (*(long **)(lVar1 + 0x30),EnumVal,stream);
      return pSVar2;
    }
  }
  return (StandardVariable *)0x0;
}

Assistant:

static DecoderBaseTyp *FactoryDecode(KINT32 EnumVal, KDataStream &stream) noexcept(false)
	{
		// Try to find a decoder
		typename std::map<KINT32, FacDecPtr>::iterator itr = m_mDecoders.find( EnumVal );
		if( itr != m_mDecoders.end() )
		{
			return itr->second->FactoryDecode( EnumVal, stream );
		}
		
		// No decoders found so return NULL.
		return 0;
	}